

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatrixMBD.h
# Opt level: O2

void __thiscall
chrono::ChStarMatrix44<double>::ChStarMatrix44(ChStarMatrix44<double> *this,ChQuaternion<double> *q)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  (this->super_ChMatrix44<double>).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[0] = q->m_data[0];
  auVar2._0_8_ = -q->m_data[1];
  auVar2._8_4_ = 0;
  auVar2._12_4_ = 0x80000000;
  dVar1 = (double)vmovlps_avx(auVar2);
  (this->super_ChMatrix44<double>).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[1] = dVar1;
  auVar3._8_4_ = 0;
  auVar3._0_8_ = -q->m_data[2];
  auVar3._12_4_ = 0x80000000;
  dVar1 = (double)vmovlps_avx(auVar3);
  (this->super_ChMatrix44<double>).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[2] = dVar1;
  auVar4._0_8_ = -q->m_data[3];
  auVar4._8_4_ = 0;
  auVar4._12_4_ = 0x80000000;
  dVar1 = (double)vmovlps_avx(auVar4);
  (this->super_ChMatrix44<double>).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[3] = dVar1;
  (this->super_ChMatrix44<double>).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[4] = q->m_data[1];
  (this->super_ChMatrix44<double>).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[5] = q->m_data[0];
  auVar5._8_4_ = 0;
  auVar5._0_8_ = -q->m_data[3];
  auVar5._12_4_ = 0x80000000;
  dVar1 = (double)vmovlps_avx(auVar5);
  (this->super_ChMatrix44<double>).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[6] = dVar1;
  dVar1 = q->m_data[2];
  (this->super_ChMatrix44<double>).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[7] = dVar1;
  (this->super_ChMatrix44<double>).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[8] = dVar1;
  (this->super_ChMatrix44<double>).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[9] = q->m_data[3];
  (this->super_ChMatrix44<double>).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[10] = q->m_data[0];
  auVar6._0_8_ = -q->m_data[1];
  auVar6._8_4_ = 0;
  auVar6._12_4_ = 0x80000000;
  dVar1 = (double)vmovlps_avx(auVar6);
  (this->super_ChMatrix44<double>).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[0xb] = dVar1;
  (this->super_ChMatrix44<double>).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[0xc] = q->m_data[3];
  auVar7._0_8_ = -q->m_data[2];
  auVar7._8_4_ = 0;
  auVar7._12_4_ = 0x80000000;
  dVar1 = (double)vmovlps_avx(auVar7);
  (this->super_ChMatrix44<double>).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[0xd] = dVar1;
  (this->super_ChMatrix44<double>).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[0xe] = q->m_data[1];
  (this->super_ChMatrix44<double>).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[0xf] = q->m_data[0];
  return;
}

Assistant:

ChStarMatrix44(const ChQuaternion<Real>& q) {
        (*this)(0, 0) = q.e0();
        (*this)(0, 1) = -q.e1();
        (*this)(0, 2) = -q.e2();
        (*this)(0, 3) = -q.e3();
        (*this)(1, 0) = q.e1();
        (*this)(1, 1) = q.e0();
        (*this)(1, 2) = -q.e3();
        (*this)(1, 3) = q.e2();
        (*this)(2, 0) = q.e2();
        (*this)(2, 1) = q.e3();
        (*this)(2, 2) = q.e0();
        (*this)(2, 3) = -q.e1();
        (*this)(3, 0) = q.e3();
        (*this)(3, 1) = -q.e2();
        (*this)(3, 2) = q.e1();
        (*this)(3, 3) = q.e0();
    }